

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *interfaceNode,Reader *replacement)

{
  ElementCount EVar1;
  ListElementCount LVar2;
  uint i;
  ElementCount index;
  SegmentReader *pSVar3;
  SegmentReader *pSVar4;
  Vector<unsigned_long> replacementSuperclasses;
  Vector<unsigned_long> superclasses;
  Reader replacementMethods;
  Reader methods;
  unsigned_long local_118;
  IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
  local_110;
  Reader *local_100;
  StructReader local_f8;
  StructReader local_c8;
  ListReader local_90;
  ListReader local_60;
  
  local_c8.data = (void *)0x0;
  local_c8.segment = (SegmentReader *)0x0;
  local_c8.capTable = (CapTableReader *)0x0;
  local_c8.pointers = (WirePointer *)&kj::NullArrayDisposer::instance;
  local_f8.segment = (SegmentReader *)0x0;
  local_f8.capTable = (CapTableReader *)0x0;
  local_f8.data = (void *)0x0;
  local_f8.pointers = (WirePointer *)&kj::NullArrayDisposer::instance;
  local_100 = interfaceNode;
  capnp::schema::Node::Interface::Reader::getSuperclasses((Reader *)&local_60,interfaceNode);
  LVar2 = local_60.elementCount;
  local_110.container = (Reader *)&local_60;
  for (local_110.index = 0; local_110.index != LVar2; local_110.index = local_110.index + 1) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
    ::operator*((Reader *)&local_90,&local_110);
    if (local_90.structDataSize < 0x40) {
      local_118 = 0;
    }
    else {
      local_118 = *(unsigned_long *)local_90.ptr;
    }
    kj::Vector<unsigned_long>::add<unsigned_long>((Vector<unsigned_long> *)&local_c8,&local_118);
  }
  capnp::schema::Node::Interface::Reader::getSuperclasses((Reader *)&local_60,replacement);
  LVar2 = local_60.elementCount;
  local_110.container = (Reader *)&local_60;
  for (local_110.index = 0; local_110.index != LVar2; local_110.index = local_110.index + 1) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
    ::operator*((Reader *)&local_90,&local_110);
    if (local_90.structDataSize < 0x40) {
      local_118 = 0;
    }
    else {
      local_118 = *(unsigned_long *)local_90.ptr;
    }
    kj::Vector<unsigned_long>::add<unsigned_long>((Vector<unsigned_long> *)&local_f8,&local_118);
  }
  std::__sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>(local_c8.segment,local_c8.capTable);
  std::__sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>(local_f8.segment,local_f8.capTable);
  pSVar3 = local_c8.segment;
  pSVar4 = local_f8.segment;
LAB_0016c6c5:
  do {
    if (pSVar3 == (SegmentReader *)local_c8.capTable) {
      if (pSVar4 != (SegmentReader *)local_f8.capTable) {
        replacementIsNewer(this);
      }
LAB_0016c722:
      kj::ArrayBuilder<unsigned_long>::dispose((ArrayBuilder<unsigned_long> *)&local_f8);
      kj::ArrayBuilder<unsigned_long>::dispose((ArrayBuilder<unsigned_long> *)&local_c8);
      capnp::schema::Node::Interface::Reader::getMethods((Reader *)&local_60,local_100);
      capnp::schema::Node::Interface::Reader::getMethods((Reader *)&local_90,replacement);
      if (local_60.elementCount < local_90.elementCount) {
        replacementIsNewer(this);
      }
      else if (local_90.elementCount < local_60.elementCount) {
        replacementIsOlder(this);
      }
      EVar1 = local_90.elementCount;
      if (local_60.elementCount < local_90.elementCount) {
        EVar1 = local_60.elementCount;
      }
      for (index = 0; EVar1 != index; index = index + 1) {
        capnp::_::ListReader::getStructElement(&local_c8,&local_60,index);
        capnp::_::ListReader::getStructElement(&local_f8,&local_90,index);
        checkCompatibility(this,(Reader *)&local_c8,(Reader *)&local_f8);
      }
      return;
    }
    if (pSVar4 == (SegmentReader *)local_f8.capTable) {
      replacementIsOlder(this);
      goto LAB_0016c722;
    }
    if (pSVar3->arena < pSVar4->arena) {
      replacementIsOlder(this);
    }
    else {
      if (pSVar4->arena < pSVar3->arena) {
        replacementIsNewer(this);
        pSVar4 = (SegmentReader *)&pSVar4->id;
        goto LAB_0016c6c5;
      }
      pSVar4 = (SegmentReader *)&pSVar4->id;
    }
    pSVar3 = (SegmentReader *)&pSVar3->id;
  } while( true );
}

Assistant:

void checkCompatibility(const schema::Node::Interface::Reader& interfaceNode,
                          const schema::Node::Interface::Reader& replacement) {
    {
      // Check superclasses.

      kj::Vector<uint64_t> superclasses;
      kj::Vector<uint64_t> replacementSuperclasses;
      for (auto superclass: interfaceNode.getSuperclasses()) {
        superclasses.add(superclass.getId());
      }
      for (auto superclass: replacement.getSuperclasses()) {
        replacementSuperclasses.add(superclass.getId());
      }
      std::sort(superclasses.begin(), superclasses.end());
      std::sort(replacementSuperclasses.begin(), replacementSuperclasses.end());

      auto iter = superclasses.begin();
      auto replacementIter = replacementSuperclasses.begin();

      while (iter != superclasses.end() || replacementIter != replacementSuperclasses.end()) {
        if (iter == superclasses.end()) {
          replacementIsNewer();
          break;
        } else if (replacementIter == replacementSuperclasses.end()) {
          replacementIsOlder();
          break;
        } else if (*iter < *replacementIter) {
          replacementIsOlder();
          ++iter;
        } else if (*iter > *replacementIter) {
          replacementIsNewer();
          ++replacementIter;
        } else {
          ++iter;
          ++replacementIter;
        }
      }
    }

    auto methods = interfaceNode.getMethods();
    auto replacementMethods = replacement.getMethods();

    if (replacementMethods.size() > methods.size()) {
      replacementIsNewer();
    } else if (replacementMethods.size() < methods.size()) {
      replacementIsOlder();
    }

    uint count = kj::min(methods.size(), replacementMethods.size());

    for (uint i = 0; i < count; i++) {
      checkCompatibility(methods[i], replacementMethods[i]);
    }
  }